

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflex.h
# Opt level: O0

void __thiscall ClassInfo::ClassInfo(ClassInfo *this,string *className,ObjectConstructorFn ctor)

{
  ObjectConstructorFn ctor_local;
  string *className_local;
  ClassInfo *this_local;
  
  this->_vptr_ClassInfo = (_func_int **)&PTR__ClassInfo_00106d50;
  std::__cxx11::string::string((string *)&this->m_className,(string *)className);
  this->m_objectConstructor = ctor;
  Object::Register(this);
  return;
}

Assistant:

ClassInfo(const std::string className, ObjectConstructorFn ctor)
            :m_className(className), m_objectConstructor(ctor)
    {
        Object::Register(this);       //classInfo的构造函数是传入类名和类对应的new函数然后自动注册进map中。
    }